

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

char * deqp::gles31::Functional::FboTestUtil::getFormatName(deUint32 format)

{
  TestError *this;
  char *pcStack_10;
  deUint32 format_local;
  
  if (format == 0x8051) {
    pcStack_10 = "rgb8";
  }
  else if (format == 0x8056) {
    pcStack_10 = "rgba4";
  }
  else if (format == 0x8057) {
    pcStack_10 = "rgb5_a1";
  }
  else if (format == 0x8058) {
    pcStack_10 = "rgba8";
  }
  else if (format == 0x8059) {
    pcStack_10 = "rgb10_a2";
  }
  else if (format == 0x81a5) {
    pcStack_10 = "depth_component16";
  }
  else if (format == 0x81a6) {
    pcStack_10 = "depth_component24";
  }
  else if (format == 0x8229) {
    pcStack_10 = "r8";
  }
  else if (format == 0x822b) {
    pcStack_10 = "rg8";
  }
  else if (format == 0x822d) {
    pcStack_10 = "r16f";
  }
  else if (format == 0x822e) {
    pcStack_10 = "r32f";
  }
  else if (format == 0x822f) {
    pcStack_10 = "rg16f";
  }
  else if (format == 0x8230) {
    pcStack_10 = "rg32f";
  }
  else if (format == 0x8231) {
    pcStack_10 = "r8i";
  }
  else if (format == 0x8232) {
    pcStack_10 = "r8ui";
  }
  else if (format == 0x8233) {
    pcStack_10 = "r16i";
  }
  else if (format == 0x8234) {
    pcStack_10 = "r16ui";
  }
  else if (format == 0x8235) {
    pcStack_10 = "r32i";
  }
  else if (format == 0x8236) {
    pcStack_10 = "r32ui";
  }
  else if (format == 0x8237) {
    pcStack_10 = "rg8i";
  }
  else if (format == 0x8238) {
    pcStack_10 = "rg8ui";
  }
  else if (format == 0x8239) {
    pcStack_10 = "rg16i";
  }
  else if (format == 0x823a) {
    pcStack_10 = "rg16ui";
  }
  else if (format == 0x823b) {
    pcStack_10 = "rg32i";
  }
  else if (format == 0x823c) {
    pcStack_10 = "rg32ui";
  }
  else if (format == 0x8814) {
    pcStack_10 = "rgba32f";
  }
  else if (format == 0x8815) {
    pcStack_10 = "rgb32f";
  }
  else if (format == 0x881a) {
    pcStack_10 = "rgba16f";
  }
  else if (format == 0x881b) {
    pcStack_10 = "rgb16f";
  }
  else if (format == 0x88f0) {
    pcStack_10 = "depth24_stencil8";
  }
  else if (format == 0x8c3a) {
    pcStack_10 = "r11f_g11f_b10f";
  }
  else if (format == 0x8c3d) {
    pcStack_10 = "rgb9_e5";
  }
  else if (format == 0x8c41) {
    pcStack_10 = "srgb8";
  }
  else if (format == 0x8c43) {
    pcStack_10 = "srgb8_alpha8";
  }
  else if (format == 0x8cac) {
    pcStack_10 = "depth_component32f";
  }
  else if (format == 0x8cad) {
    pcStack_10 = "depth32f_stencil8";
  }
  else if (format == 0x8d48) {
    pcStack_10 = "stencil_index8";
  }
  else if (format == 0x8d62) {
    pcStack_10 = "rgb565";
  }
  else if (format == 0x8d70) {
    pcStack_10 = "rgba32ui";
  }
  else if (format == 0x8d71) {
    pcStack_10 = "rgb32ui";
  }
  else if (format == 0x8d76) {
    pcStack_10 = "rgba16ui";
  }
  else if (format == 0x8d77) {
    pcStack_10 = "rgb16ui";
  }
  else if (format == 0x8d7c) {
    pcStack_10 = "rgba8ui";
  }
  else if (format == 0x8d7d) {
    pcStack_10 = "rgb8ui";
  }
  else if (format == 0x8d82) {
    pcStack_10 = "rgba32i";
  }
  else if (format == 0x8d83) {
    pcStack_10 = "rgb32i";
  }
  else if (format == 0x8d88) {
    pcStack_10 = "rgba16i";
  }
  else if (format == 0x8d89) {
    pcStack_10 = "rgb16i";
  }
  else if (format == 0x8d8e) {
    pcStack_10 = "rgba8i";
  }
  else if (format == 0x8d8f) {
    pcStack_10 = "rgb8i";
  }
  else if (format == 0x8f94) {
    pcStack_10 = "r8_snorm";
  }
  else if (format == 0x8f95) {
    pcStack_10 = "rg8_snorm";
  }
  else if (format == 0x8f96) {
    pcStack_10 = "rgb8_snorm";
  }
  else if (format == 0x8f97) {
    pcStack_10 = "rgba8_snorm";
  }
  else {
    if (format != 0x906f) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unknown format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestUtil.cpp"
                 ,0x222);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcStack_10 = "rgb10_a2ui";
  }
  return pcStack_10;
}

Assistant:

const char* getFormatName (deUint32 format)
{
	switch (format)
	{
		case GL_RGB565:				return "rgb565";
		case GL_RGB5_A1:			return "rgb5_a1";
		case GL_RGBA4:				return "rgba4";
		case GL_DEPTH_COMPONENT16:	return "depth_component16";
		case GL_STENCIL_INDEX8:		return "stencil_index8";
		case GL_RGBA32F:			return "rgba32f";
		case GL_RGBA32I:			return "rgba32i";
		case GL_RGBA32UI:			return "rgba32ui";
		case GL_RGBA16F:			return "rgba16f";
		case GL_RGBA16I:			return "rgba16i";
		case GL_RGBA16UI:			return "rgba16ui";
		case GL_RGBA8:				return "rgba8";
		case GL_RGBA8I:				return "rgba8i";
		case GL_RGBA8UI:			return "rgba8ui";
		case GL_SRGB8_ALPHA8:		return "srgb8_alpha8";
		case GL_RGB10_A2:			return "rgb10_a2";
		case GL_RGB10_A2UI:			return "rgb10_a2ui";
		case GL_RGBA8_SNORM:		return "rgba8_snorm";
		case GL_RGB8:				return "rgb8";
		case GL_R11F_G11F_B10F:		return "r11f_g11f_b10f";
		case GL_RGB32F:				return "rgb32f";
		case GL_RGB32I:				return "rgb32i";
		case GL_RGB32UI:			return "rgb32ui";
		case GL_RGB16F:				return "rgb16f";
		case GL_RGB16I:				return "rgb16i";
		case GL_RGB16UI:			return "rgb16ui";
		case GL_RGB8_SNORM:			return "rgb8_snorm";
		case GL_RGB8I:				return "rgb8i";
		case GL_RGB8UI:				return "rgb8ui";
		case GL_SRGB8:				return "srgb8";
		case GL_RGB9_E5:			return "rgb9_e5";
		case GL_RG32F:				return "rg32f";
		case GL_RG32I:				return "rg32i";
		case GL_RG32UI:				return "rg32ui";
		case GL_RG16F:				return "rg16f";
		case GL_RG16I:				return "rg16i";
		case GL_RG16UI:				return "rg16ui";
		case GL_RG8:				return "rg8";
		case GL_RG8I:				return "rg8i";
		case GL_RG8UI:				return "rg8ui";
		case GL_RG8_SNORM:			return "rg8_snorm";
		case GL_R32F:				return "r32f";
		case GL_R32I:				return "r32i";
		case GL_R32UI:				return "r32ui";
		case GL_R16F:				return "r16f";
		case GL_R16I:				return "r16i";
		case GL_R16UI:				return "r16ui";
		case GL_R8:					return "r8";
		case GL_R8I:				return "r8i";
		case GL_R8UI:				return "r8ui";
		case GL_R8_SNORM:			return "r8_snorm";
		case GL_DEPTH_COMPONENT32F:	return "depth_component32f";
		case GL_DEPTH_COMPONENT24:	return "depth_component24";
		case GL_DEPTH32F_STENCIL8:	return "depth32f_stencil8";
		case GL_DEPTH24_STENCIL8:	return "depth24_stencil8";

		default:
			TCU_FAIL("Unknown format");
	}
}